

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_rw_hook_set(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  long lVar1;
  undefined8 uVar2;
  code *pcVar3;
  fio_data_s *pfVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  iVar5 = fio_is_closed(uuid);
  iVar6 = -1;
  if (iVar5 == 0) {
    fio_rw_hook_validate(rw_hooks);
    iVar5 = (int)((ulong)uuid >> 8);
    lVar7 = (long)iVar5 * 0xa8;
    fio_lock((fio_lock_i *)((long)fio_data + lVar7 + 0x6e));
    pfVar4 = fio_data;
    if (CONCAT41(iVar5,*(undefined1 *)((long)fio_data + lVar7 + 0x6d)) == uuid) {
      lVar1 = *(long *)((long)fio_data + lVar7 + 0xa8);
      uVar2 = *(undefined8 *)((long)fio_data + lVar7 + 0xb0);
      *(fio_rw_hook_s **)((long)fio_data + lVar7 + 0xa8) = rw_hooks;
      *(void **)((long)pfVar4 + lVar7 + 0xb0) = udata;
      LOCK();
      *(undefined1 *)((long)pfVar4 + lVar7 + 0x6e) = 0;
      UNLOCK();
      iVar6 = 0;
      if ((lVar1 != 0) && (pcVar3 = *(code **)(lVar1 + 0x20), iVar6 = 0, pcVar3 != (code *)0x0)) {
        (*pcVar3)(uVar2);
      }
    }
    else {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar7 + 0x6e) = 0;
      UNLOCK();
    }
  }
  return iVar6;
}

Assistant:

int fio_rw_hook_set(intptr_t uuid, fio_rw_hook_s *rw_hooks, void *udata) {
  if (fio_is_closed(uuid))
    goto invalid_uuid;
  fio_rw_hook_validate(rw_hooks);
  intptr_t fd = fio_uuid2fd(uuid);
  fio_rw_hook_s *old_rw_hooks;
  void *old_udata;
  fio_lock(&fd_data(fd).sock_lock);
  if (fd2uuid(fd) != uuid) {
    fio_unlock(&fd_data(fd).sock_lock);
    goto invalid_uuid;
  }
  old_rw_hooks = fd_data(fd).rw_hooks;
  old_udata = fd_data(fd).rw_udata;
  fd_data(fd).rw_hooks = rw_hooks;
  fd_data(fd).rw_udata = udata;
  fio_unlock(&fd_data(fd).sock_lock);
  if (old_rw_hooks && old_rw_hooks->cleanup)
    old_rw_hooks->cleanup(old_udata);
  return 0;
invalid_uuid:
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup(udata);
  return -1;
}